

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belongingStructure.cpp
# Opt level: O1

void pushNew(BelongStructure *bs,float atk,int *belonging)

{
  pointer *pppiVar1;
  iterator __position;
  iterator __position_00;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int *ptr;
  float local_1c;
  int *local_18;
  
  if (bs->biggestAtk - (float)nearing_coef <= atk) {
    local_1c = atk;
    local_18 = (int *)operator_new__(0x40);
    uVar2 = *(undefined8 *)belonging;
    uVar3 = *(undefined8 *)(belonging + 2);
    uVar4 = *(undefined8 *)(belonging + 4);
    uVar5 = *(undefined8 *)(belonging + 6);
    uVar6 = *(undefined8 *)(belonging + 8);
    uVar7 = *(undefined8 *)(belonging + 10);
    uVar8 = *(undefined8 *)(belonging + 0xe);
    *(undefined8 *)(local_18 + 0xc) = *(undefined8 *)(belonging + 0xc);
    *(undefined8 *)(local_18 + 0xe) = uVar8;
    *(undefined8 *)(local_18 + 8) = uVar6;
    *(undefined8 *)(local_18 + 10) = uVar7;
    *(undefined8 *)(local_18 + 4) = uVar4;
    *(undefined8 *)(local_18 + 6) = uVar5;
    *(undefined8 *)local_18 = uVar2;
    *(undefined8 *)(local_18 + 2) = uVar3;
    __position._M_current =
         (bs->belongings).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (bs->belongings).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int*,std::allocator<int*>>::_M_realloc_insert<int*const&>
                ((vector<int*,std::allocator<int*>> *)&bs->belongings,__position,&local_18);
    }
    else {
      *__position._M_current = local_18;
      pppiVar1 = &(bs->belongings).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppiVar1 = *pppiVar1 + 1;
    }
    __position_00._M_current =
         (bs->as).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    if (__position_00._M_current ==
        (bs->as).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                ((vector<float,std::allocator<float>> *)&bs->as,__position_00,&local_1c);
    }
    else {
      *__position_00._M_current = local_1c;
      (bs->as).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = __position_00._M_current + 1;
    }
  }
  return;
}

Assistant:

void pushNew(BelongStructure *bs,float atk,int *belonging){
        if(atk<bs->biggestAtk-nearing_coef)return;
        int *ptr = new int[16];
        for(int i=0;i<16;i++)
            ptr[i]=belonging[i];
        bs->belongings.push_back(ptr);
        bs->as.push_back(atk);
    }